

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall OmegaOP::algoISOTONIC(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  double **ppdVar6;
  ulong uVar7;
  uint *puVar8;
  double dVar9;
  uint local_88;
  uint local_84;
  uint u;
  uint t;
  uint v;
  uint T;
  uint nbPosition;
  uint indexTheV;
  double theV;
  uint theEnd;
  uint theStart;
  uint *u2;
  uint *u1;
  uint temp_indState;
  int temp_chpt;
  double temp_Q;
  double temp_cost;
  uint local_30;
  uint uStack_2c;
  Costs cost;
  uint p;
  uint n;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaOP *this_local;
  
  sVar5 = std::vector<double,_std::allocator<double>_>::size(data);
  uStack_2c = (uint)sVar5;
  local_30 = this->nbStates;
  Costs::Costs((Costs *)((long)&temp_cost + 7));
  temp_Q = 0.0;
  _temp_indState = -1.0;
  u1._4_4_ = 0xffffffff;
  u1._0_4_ = 0;
  ppdVar6 = preprocessing(this,data);
  this->S12P = ppdVar6;
  auVar2 = ZEXT416(uStack_2c + 1) * ZEXT816(4);
  uVar7 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  u2 = (uint *)operator_new__(uVar7);
  auVar2 = ZEXT416(uStack_2c + 1) * ZEXT816(4);
  uVar7 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  _theEnd = operator_new__(uVar7);
  _nbPosition = 0.0;
  T = 0;
  v = 0;
  for (t = 2; t < uStack_2c + 1; t = t + 1) {
    theV._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (theV._4_4_ < local_30 - 1) {
        bVar3 = this->Q[theV._4_4_ + 1][t - 1] <= this->Q[theV._4_4_][t - 1] &&
                this->Q[theV._4_4_][t - 1] != this->Q[theV._4_4_ + 1][t - 1];
      }
      if (!bVar3) break;
      theV._4_4_ = theV._4_4_ + 1;
    }
    u2[t - 1] = theV._4_4_;
    uVar4 = local_30;
    do {
      theV._0_4_ = uVar4 - 1;
      bVar3 = false;
      if (theV._0_4_ != 0) {
        bVar3 = this->Q[uVar4 - 2][t - 1] <= this->Q[theV._0_4_][t - 1] &&
                this->Q[theV._0_4_][t - 1] != this->Q[uVar4 - 2][t - 1];
      }
      uVar4 = theV._0_4_;
    } while (bVar3);
    *(uint *)((long)_theEnd + (ulong)(t - 1) * 4) = theV._0_4_;
    for (u = 0; u < local_30; u = u + 1) {
      _temp_indState = INFINITY;
      u1._0_4_ = 0;
      u1._4_4_ = 0;
      for (local_84 = 1; local_84 < t; local_84 = local_84 + 1) {
        if (local_84 < t - 1) {
          _nbPosition = Costs::vhat((Costs *)((long)&temp_cost + 7),this->states + u,&local_84,&t,
                                    *this->S12P + local_84,*this->S12P + t,this->S12P[2] + local_84,
                                    this->S12P[2] + t);
          T = Costs::closestStateIndex
                        ((Costs *)((long)&temp_cost + 7),(double *)&nbPosition,this->states,local_30
                        );
        }
        else {
          T = u2[t - 1];
        }
        puVar8 = std::min<unsigned_int>(u2 + local_84,&T);
        puVar8 = std::min<unsigned_int>(puVar8,&u);
        local_88 = *puVar8;
        while( true ) {
          puVar8 = std::max<unsigned_int>((uint *)((long)_theEnd + (ulong)local_84 * 4),&T);
          puVar8 = std::min<unsigned_int>(puVar8,&u);
          if (*puVar8 + 1 <= local_88) break;
          v = v + 1;
          dVar1 = this->Q[local_88][local_84];
          dVar9 = Costs::slopeCost((Costs *)((long)&temp_cost + 7),this->states + local_88,
                                   this->states + u,&local_84,&t,*this->S12P + local_84,
                                   *this->S12P + t,this->S12P[1] + local_84,this->S12P[1] + t,
                                   this->S12P[2] + local_84,this->S12P[2] + t);
          temp_Q = dVar1 + dVar9 + this->penalty;
          if (temp_Q < _temp_indState) {
            u1._0_4_ = local_88;
            u1._4_4_ = local_84;
            _temp_indState = temp_Q;
          }
          local_88 = local_88 + 1;
        }
      }
      this->Q[u][t] = _temp_indState;
      this->lastChpt[u][t] = u1._4_4_;
      this->lastIndState[u][t] = (uint)u1;
    }
  }
  this->pruning =
       ((double)v + (double)v) /
       ((double)local_30 * (double)local_30 * (double)uStack_2c * (double)(uStack_2c - 1));
  if (u2 != (uint *)0x0) {
    operator_delete__(u2);
  }
  u2 = (uint *)0x0;
  if (_theEnd != (void *)0x0) {
    operator_delete__(_theEnd);
  }
  return;
}

Assistant:

void OmegaOP::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
    {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
    {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) with add. constaint u <= v
        for(unsigned int u = std::min(std::min(u1[t],indexTheV), v); u < std::min(std::max(u2[t],indexTheV), v) + 1; u++) /////explore column of states
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}